

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_PolyCurve::Split(ON_PolyCurve *this,double split_parameter,ON_Curve **left_side,
                   ON_Curve **right_side)

{
  double **ppdVar1;
  ON_Curve *pOVar2;
  bool bVar3;
  int iVar4;
  ON_PolyCurve *this_00;
  ON_PolyCurve *this_01;
  double *pdVar5;
  long lVar6;
  ON_Curve **ppOVar7;
  uint i;
  long lVar8;
  ON_PolyCurve *this_ptr;
  long lVar9;
  double dVar10;
  int si;
  ON_Curve **local_100;
  double local_f8;
  ON_Curve *local_f0;
  double split_parameter_local;
  ON_Interval c_dom;
  ON_SimpleArray<ON_Curve_*> right_segment;
  ON_SimpleArray<ON_Curve_*> left_segment;
  ON_Curve *local_98;
  ON_Curve *seg_left;
  ON_SimpleArray<double> left_t;
  ON_SimpleArray<double> right_t;
  ON_Interval s_dom;
  ON_Interval dom;
  
  local_f8 = split_parameter;
  split_parameter_local = split_parameter;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  this_00 = Cast((ON_Object *)*left_side);
  this_01 = Cast((ON_Object *)*right_side);
  if (this_00 == this || this_00 == (ON_PolyCurve *)0x0) {
    if (this_00 == this) {
      ON_Curve::DestroyCurveTree(&this_00->super_ON_Curve);
    }
  }
  else {
    Destroy(this_00);
  }
  if (this_01 == this || this_01 == (ON_PolyCurve *)0x0) {
    if (this_01 == this) {
      ON_Curve::DestroyCurveTree(&this_01->super_ON_Curve);
    }
  }
  else {
    Destroy(this_01);
  }
  if ((((this_00 == (ON_PolyCurve *)0x0) && (*left_side != (ON_Curve *)0x0)) ||
      ((this_01 == (ON_PolyCurve *)0x0 && (*right_side != (ON_Curve *)0x0)))) ||
     (bVar3 = ON_Interval::Includes(&dom,local_f8,true), !bVar3)) {
    return false;
  }
  local_f8 = (double)CONCAT71(local_f8._1_7_,this_00 != this);
  bVar3 = ParameterSearch(this,split_parameter_local,&si,true);
  if (bVar3) {
    if (si < 1) {
      return false;
    }
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= si) {
      return false;
    }
  }
  s_dom = SegmentDomain(this,si);
  c_dom.m_t[1] = s_dom.m_t[1];
  if ((long)si < 0) {
    return false;
  }
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= si) {
    return false;
  }
  pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[si];
  if (pOVar2 == (ON_Curve *)0x0) {
    return false;
  }
  (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar2);
  if (bVar3) {
    pdVar5 = ON_Interval::operator[](&c_dom,0);
    local_100 = (ON_Curve **)*pdVar5;
    seg_left = (ON_Curve *)0x0;
    local_98 = (ON_Curve *)0x0;
LAB_0059827b:
    dVar10 = ON_Interval::ParameterAt(&c_dom,0.5);
    i = (uint)(dVar10 < (double)local_100);
LAB_00598299:
    pdVar5 = ON_Interval::operator[](&c_dom,i);
    local_100 = (ON_Curve **)*pdVar5;
  }
  else {
    local_100 = (ON_Curve **)ON_Interval::TransformParameterTo(&s_dom,&c_dom,split_parameter_local);
    seg_left = (ON_Curve *)0x0;
    local_98 = (ON_Curve *)0x0;
    bVar3 = ON_Interval::Includes(&c_dom,(double)local_100,true);
    if (!bVar3) goto LAB_0059827b;
    iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (local_100,pOVar2,&seg_left,&local_98);
    if ((char)iVar4 == '\0') {
      dVar10 = ON_Interval::NormalizedParameterAt(&c_dom,(double)local_100);
      i = 0;
      if (0.001 < dVar10) {
        dVar10 = ON_Interval::NormalizedParameterAt(&c_dom,(double)local_100);
        i = 1;
        if (dVar10 < 0.999) {
          return false;
        }
      }
      goto LAB_00598299;
    }
  }
  local_f8 = (double)CONCAT71(local_f8._1_7_,local_f8._0_1_ & this_01 != this);
  left_segment._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081dee8;
  left_segment.m_a = (ON_Curve **)0x0;
  left_segment.m_count = 0;
  left_segment.m_capacity = 0;
  right_segment._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081dee8;
  right_segment.m_a = (ON_Curve **)0x0;
  right_segment.m_count = 0;
  right_segment.m_capacity = 0;
  left_t._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c348;
  left_t.m_a = (double *)0x0;
  left_t.m_count = 0;
  left_t.m_capacity = 0;
  right_t._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c348;
  right_t.m_a = (double *)0x0;
  right_t.m_count = 0;
  right_t.m_capacity = 0;
  if ((seg_left == (ON_Curve *)0x0) || (local_98 == (ON_Curve *)0x0)) {
    pdVar5 = ON_Interval::operator[](&c_dom,1);
    if (((double)local_100 == *pdVar5) && (!NAN((double)local_100) && !NAN(*pdVar5))) {
      si = si + 1;
    }
    pdVar5 = ON_Interval::operator[](&c_dom,0);
    if ((((double)local_100 != *pdVar5) || (NAN((double)local_100) || NAN(*pdVar5))) || (si != 0)) {
      pdVar5 = ON_Interval::operator[](&c_dom,1);
      if ((((double)local_100 != *pdVar5) || (NAN((double)local_100) || NAN(*pdVar5))) ||
         (si != (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
        ON_SimpleArray<ON_Curve_*>::Reserve(&left_segment,(long)si);
        ON_SimpleArray<ON_Curve_*>::Reserve
                  (&right_segment,
                   (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count - (long)si);
        ON_SimpleArray<double>::Reserve(&left_t,(long)left_segment.m_count + 1);
        ON_SimpleArray<double>::Reserve(&right_t,(long)right_segment.m_count + 1);
        ppdVar1 = &(this->m_t).m_a;
        lVar9 = 0;
        local_100 = right_side;
        for (lVar6 = 0; lVar6 < si; lVar6 = lVar6 + 1) {
          if (local_f8._0_1_ == '\0') {
            ON_SimpleArray<ON_Curve_*>::Append
                      (&left_segment,
                       (ON_Curve **)
                       ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
          }
          else {
            local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                            ((long)(this->m_segment).
                                                   super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
            ON_SimpleArray<ON_Curve_*>::Append(&left_segment,&local_f0);
          }
          ON_SimpleArray<double>::Append(&left_t,(double *)((long)*ppdVar1 + lVar9));
          lVar9 = lVar9 + 8;
        }
        ON_SimpleArray<double>::Append(&left_t,&split_parameter_local);
        lVar9 = (long)si;
        lVar6 = lVar9 * 8;
        for (; lVar8 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,
            lVar9 < lVar8; lVar9 = lVar9 + 1) {
          if (local_f8._0_1_ == '\0') {
            ON_SimpleArray<ON_Curve_*>::Append
                      (&right_segment,
                       (ON_Curve **)
                       ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar6));
          }
          else {
            local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                            ((long)(this->m_segment).
                                                   super_ON_SimpleArray<ON_Curve_*>.m_a + lVar6));
            ON_SimpleArray<ON_Curve_*>::Append(&right_segment,&local_f0);
          }
          pdVar5 = (double *)((long)*ppdVar1 + lVar6);
          if ((int)lVar9 == si) {
            pdVar5 = &split_parameter_local;
          }
          ON_SimpleArray<double>::Append(&right_t,pdVar5);
          lVar6 = lVar6 + 8;
        }
        goto LAB_00598566;
      }
    }
    bVar3 = false;
  }
  else {
    ON_SimpleArray<ON_Curve_*>::Reserve(&left_segment,(long)si + 1);
    ON_SimpleArray<ON_Curve_*>::Reserve
              (&right_segment,
               (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count - (long)si);
    ON_SimpleArray<double>::Reserve(&left_t,(long)left_segment.m_count + 1);
    ON_SimpleArray<double>::Reserve(&right_t,(long)right_segment.m_count + 1);
    if (local_f8._0_1_ == '\0') {
      lVar6 = (long)si;
      ppOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      if (ppOVar7[lVar6] != (ON_Curve *)0x0) {
        (*(ppOVar7[lVar6]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        lVar6 = (long)si;
        ppOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      }
      ppOVar7[lVar6] = (ON_Curve *)0x0;
    }
    ppdVar1 = &(this->m_t).m_a;
    lVar9 = 0;
    local_100 = right_side;
    for (lVar6 = 0; lVar6 < si; lVar6 = lVar6 + 1) {
      if (local_f8._0_1_ == '\0') {
        ON_SimpleArray<ON_Curve_*>::Append
                  (&left_segment,
                   (ON_Curve **)
                   ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
      }
      else {
        local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                        ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                               m_a + lVar9));
        ON_SimpleArray<ON_Curve_*>::Append(&left_segment,&local_f0);
      }
      ON_SimpleArray<double>::Append(&left_t,(double *)((long)*ppdVar1 + lVar9));
      lVar9 = lVar9 + 8;
    }
    ON_SimpleArray<ON_Curve_*>::Append(&left_segment,&seg_left);
    ON_SimpleArray<double>::Append(&left_t,*ppdVar1 + si);
    ON_SimpleArray<double>::Append(&left_t,&split_parameter_local);
    ON_SimpleArray<ON_Curve_*>::Append(&right_segment,&local_98);
    ON_SimpleArray<double>::Append(&right_t,&split_parameter_local);
    lVar9 = (long)si;
    lVar6 = lVar9 * 8;
    while( true ) {
      lVar6 = lVar6 + 8;
      lVar9 = lVar9 + 1;
      lVar8 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
      if (lVar8 <= lVar9) break;
      if (local_f8._0_1_ == '\0') {
        ON_SimpleArray<ON_Curve_*>::Append
                  (&right_segment,
                   (ON_Curve **)
                   ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar6));
      }
      else {
        local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                        ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                               m_a + lVar6));
        ON_SimpleArray<ON_Curve_*>::Append(&right_segment,&local_f0);
      }
      ON_SimpleArray<double>::Append(&right_t,(double *)(lVar6 + (long)*ppdVar1));
    }
LAB_00598566:
    ON_SimpleArray<double>::Append(&right_t,(this->m_t).m_a + lVar8);
    ppOVar7 = local_100;
    if (this_00 == (ON_PolyCurve *)0x0) {
      this_00 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(this_00);
    }
    if (this_01 == (ON_PolyCurve *)0x0) {
      this_01 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(this_01);
    }
    if (local_f8._0_1_ == '\0') {
      ON_SimpleArray<ON_Curve_*>::Zero(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
      ON_SimpleArray<double>::Zero(&this->m_t);
      if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
        (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
      }
      if (-1 < (this->m_t).m_capacity) {
        (this->m_t).m_count = 0;
      }
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this_00->m_segment).super_ON_SimpleArray<ON_Curve_*>,left_segment.m_count,
               left_segment.m_a);
    ON_SimpleArray<double>::Append(&this_00->m_t,left_t.m_count,left_t.m_a);
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this_01->m_segment).super_ON_SimpleArray<ON_Curve_*>,right_segment.m_count,
               right_segment.m_a);
    ON_SimpleArray<double>::Append(&this_01->m_t,right_t.m_count,right_t.m_a);
    *left_side = &this_00->super_ON_Curve;
    *ppOVar7 = &this_01->super_ON_Curve;
    bVar3 = true;
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&right_t);
  ON_SimpleArray<double>::~ON_SimpleArray(&left_t);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&right_segment);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&left_segment);
  return bVar3;
}

Assistant:

bool ON_PolyCurve::Split(
    double split_parameter,
    ON_Curve*& left_side, // left portion returned here
    ON_Curve*& right_side // right portion returned here
  ) const
{
  int si;
  ON_Interval dom = Domain();
  
  ON_PolyCurve* pLeftSide  = ON_PolyCurve::Cast(left_side);
  ON_PolyCurve* pRightSide = ON_PolyCurve::Cast(right_side);

  if ( pLeftSide && pLeftSide != this )
    pLeftSide->Destroy();
  else if ( pLeftSide == this )
    pLeftSide->DestroyCurveTree();

  if ( pRightSide && pRightSide != this )
    pRightSide->Destroy();
  else if ( pRightSide == this )
    pRightSide->DestroyCurveTree();

  if ( left_side && !pLeftSide )
    return false;
  if ( right_side && !pRightSide )
    return false;
  if ( !dom.Includes( split_parameter, true ) )
    return false; // split_parameter is not an interior parameter


  const bool bDupSegs = ( this != pLeftSide && this != pRightSide );

		/* 4 April 2003 Greg Arden		Made the following changes:
																		1.	Use ParameterSearch() to decide if we should snap domain
																				boundaries to m_t array values.
																		2.  Make sure resulting polycurves have Domain() specified as 
																				split parameter.   
																		3.  When true is returned the result passes IsValid().
		*/
	bool split_at_break = ParameterSearch(split_parameter, si, true);
	if( split_at_break && (si<=0 || si>=Count() ) )
		return false;

	ON_Interval s_dom = SegmentDomain(si);
  ON_Curve* seg_curve = SegmentCurve(si);
  if ( !seg_curve )
    return false;
  ON_Interval c_dom = seg_curve->Domain();

  double c;
  if (split_at_break)
    c = c_dom[0];
  else
    c = s_dom.TransformParameterTo(c_dom, split_parameter);

  ON_Curve* seg_left = 0;
  ON_Curve* seg_right = 0;

  if ( !split_at_break  && c_dom.Includes(c,true) )
  {
    if ( !seg_curve->Split( c, seg_left, seg_right ) )
    {
      double fuzz = 0.001; // anything small and > 1.0e-6 will work about the same.
      if ( c_dom.NormalizedParameterAt(c) <= fuzz )
        c = c_dom[0];
      else if ( c_dom.NormalizedParameterAt(c) >= 1.0 - fuzz )
        c = c_dom[1];
      else
        return false; // unable to split this segment
    }
  }
  else if ( c <= c_dom.ParameterAt(0.5) )
    c = c_dom[0];
  else
    c = c_dom[1];

  // use scratch arrays since this may also be pLeftSide or pRightSide
  ON_SimpleArray< ON_Curve* > left_segment;
  ON_SimpleArray< ON_Curve* > right_segment;
  ON_SimpleArray< double > left_t;
  ON_SimpleArray< double > right_t;

  int i;

  if ( seg_left && seg_right )
  {
    // we split a segment
    left_segment.Reserve(si+1);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    if ( !bDupSegs )
    {
      delete m_segment[si];
      const_cast<ON_PolyCurve*>(this)->m_segment[si] = 0;
    }
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_segment.Append( seg_left );
    left_t.Append( m_t[si] );
    left_t.Append( split_parameter );

    right_segment.Append(seg_right);
    right_t.Append( split_parameter );
    for ( i = si+1; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }
  else 
  {
    if ( c == c_dom[1] )
      si++;
		if( (c==c_dom[0] && si==0 ) ||								// attempting split at curve start
				(c==c_dom[1] && si==m_segment.Count() ) )	// attempting split at curve end
			return false;

    left_segment.Reserve(si);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_t.Append( split_parameter );

    for ( i = si; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      if ( i == si )
        right_t.Append( split_parameter );
      else
        right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }

  if ( !pLeftSide )
    pLeftSide = new ON_PolyCurve();
  if ( !pRightSide )
    pRightSide = new ON_PolyCurve();
  if ( !bDupSegs )
  {
    // pLeftSide or pRightSide is the same as this
    ON_PolyCurve* this_ptr = const_cast<ON_PolyCurve*>(this);
    this_ptr->m_segment.Zero();
    this_ptr->m_t.Zero();
    this_ptr->m_segment.SetCount(0);
    this_ptr->m_t.SetCount(0);
  }

  pLeftSide->m_segment.Append( left_segment.Count(), left_segment.Array() );
  pLeftSide->m_t.Append( left_t.Count(), left_t.Array() );
  pRightSide->m_segment.Append( right_segment.Count(), right_segment.Array() );
  pRightSide->m_t.Append( right_t.Count(), right_t.Array() );

  left_side = pLeftSide;
  right_side = pRightSide;

  return true;
}